

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O0

int parsedate(char *date,time_t *output)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  long slnum;
  int local_d8;
  int old_errno;
  int error;
  long lval;
  time_t *ptStack_b0;
  int len_1;
  char *end;
  size_t sStack_a0;
  int val;
  size_t len;
  char buf [32];
  _Bool found;
  int part;
  char *indate;
  undefined1 local_60 [4];
  assume dignext;
  my_tm tm;
  int tzoff;
  int yearnum;
  int secnum;
  int minnum;
  int hournum;
  int mdaynum;
  int monnum;
  int wdaynum;
  time_t t;
  time_t *output_local;
  char *date_local;
  
  _monnum = 0;
  mdaynum = -1;
  hournum = -1;
  minnum = -1;
  secnum = -1;
  yearnum = -1;
  tzoff = -1;
  tm.tm_year = -1;
  tm.tm_mon = -1;
  bVar2 = false;
  buf[0x1c] = '\0';
  buf[0x1d] = '\0';
  buf[0x1e] = '\0';
  buf[0x1f] = '\0';
  t = (time_t)output;
  output_local = (time_t *)date;
  do {
    if ((char)*output_local == '\0' || 5 < (int)buf._28_4_) {
      if (tzoff == -1) {
        secnum = 0;
        yearnum = 0;
        tzoff = 0;
      }
      if (((minnum == -1) || (hournum == -1)) || (tm.tm_year == -1)) {
        date_local._4_4_ = -1;
      }
      else if (tm.tm_year < 0x62f) {
        date_local._4_4_ = -1;
      }
      else if (((minnum < 0x20) && (hournum < 0xc)) &&
              ((secnum < 0x18 && ((yearnum < 0x3c && (tzoff < 0x3d)))))) {
        local_60 = (undefined1  [4])tzoff;
        dignext = yearnum;
        tm.tm_sec = secnum;
        tm.tm_min = minnum;
        tm.tm_hour = hournum;
        tm.tm_mday = tm.tm_year;
        my_timegm((my_tm *)local_60,(time_t *)&monnum);
        if (tm.tm_mon == -1) {
          tm.tm_mon = 0;
        }
        if ((tm.tm_mon < 1) || (_monnum <= 0x7fffffffffffffff - (long)tm.tm_mon)) {
          *(long *)t = tm.tm_mon + _monnum;
          date_local._4_4_ = 0;
        }
        else {
          *(undefined8 *)t = 0x7fffffffffffffff;
          date_local._4_4_ = 1;
        }
      }
      else {
        date_local._4_4_ = -1;
      }
      return date_local._4_4_;
    }
    buf[0x1b] = '\0';
    skip((char **)&output_local);
    iVar3 = Curl_isalpha((uint)(byte)*output_local);
    if (iVar3 == 0) {
      iVar3 = Curl_isdigit((uint)(byte)*output_local);
      if (iVar3 != 0) {
        lval._4_4_ = 0;
        if ((tzoff == -1) &&
           (iVar3 = __isoc99_sscanf(output_local,"%02d:%02d:%02d%n",&secnum,&yearnum,&tzoff,
                                    (long)&lval + 4), iVar3 == 3)) {
          output_local = (time_t *)((long)output_local + (long)lval._4_4_);
        }
        else if ((tzoff == -1) &&
                (iVar3 = __isoc99_sscanf(output_local,"%02d:%02d%n",&secnum,&yearnum,(long)&lval + 4
                                        ), iVar3 == 2)) {
          output_local = (time_t *)((long)output_local + (long)lval._4_4_);
          tzoff = 0;
        }
        else {
          piVar4 = __errno_location();
          iVar3 = *piVar4;
          piVar4 = __errno_location();
          *piVar4 = 0;
          slnum = strtol((char *)output_local,(char **)&stack0xffffffffffffff50,10);
          piVar4 = __errno_location();
          iVar1 = *piVar4;
          piVar4 = __errno_location();
          if (*piVar4 != iVar3) {
            piVar4 = __errno_location();
            *piVar4 = iVar3;
          }
          if (iVar1 != 0) {
            return -1;
          }
          if ((0x7fffffff < slnum) || (slnum < -0x80000000)) {
            return -1;
          }
          end._4_4_ = curlx_sltosi(slnum);
          if (((((tm.tm_mon == -1) && ((long)ptStack_b0 - (long)output_local == 4)) &&
               (end._4_4_ < 0x579)) && (date < output_local)) &&
             ((*(char *)((long)output_local + -1) == '+' ||
              (*(char *)((long)output_local + -1) == '-')))) {
            buf[0x1b] = '\x01';
            iVar3 = (end._4_4_ / 100) * 0x3c + end._4_4_ % 100;
            local_d8 = iVar3 * 0x3c;
            if (*(char *)((long)output_local + -1) == '+') {
              local_d8 = iVar3 * -0x3c;
            }
            tm.tm_mon = local_d8;
          }
          if ((((long)ptStack_b0 - (long)output_local == 8) && (tm.tm_year == -1)) &&
             ((hournum == -1 && (minnum == -1)))) {
            buf[0x1b] = '\x01';
            tm.tm_year = end._4_4_ / 10000;
            hournum = (int)((long)((ulong)(uint)((int)((long)end._4_4_ % 10000) >> 0x1f) << 0x20 |
                                  (long)end._4_4_ % 10000 & 0xffffffffU) / 100) + -1;
            minnum = end._4_4_ % 100;
          }
          if ((((buf[0x1b] & 1U) == 0) && (!bVar2)) && (minnum == -1)) {
            if ((0 < end._4_4_) && (end._4_4_ < 0x20)) {
              buf[0x1b] = '\x01';
              minnum = end._4_4_;
            }
            bVar2 = true;
          }
          if ((((buf[0x1b] & 1U) == 0) && (bVar2)) && (tm.tm_year == -1)) {
            buf[0x1b] = '\x01';
            tm.tm_year = end._4_4_;
            if (end._4_4_ < 100) {
              if (end._4_4_ < 0x47) {
                tm.tm_year = end._4_4_ + 2000;
              }
              else {
                tm.tm_year = end._4_4_ + 0x76c;
              }
            }
            if (minnum == -1) {
              bVar2 = false;
            }
          }
          if ((buf[0x1b] & 1U) == 0) {
            return -1;
          }
          output_local = ptStack_b0;
        }
      }
    }
    else {
      memset(&len,0,0x20);
      iVar3 = __isoc99_sscanf(output_local,
                              "%31[ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz]",&len);
      if (iVar3 == 0) {
        sStack_a0 = 0;
      }
      else {
        sStack_a0 = strlen((char *)&len);
      }
      if ((mdaynum == -1) && (mdaynum = checkday((char *)&len,sStack_a0), mdaynum != -1)) {
        buf[0x1b] = '\x01';
      }
      if ((((buf[0x1b] & 1U) == 0) && (hournum == -1)) &&
         (hournum = checkmonth((char *)&len), hournum != -1)) {
        buf[0x1b] = '\x01';
      }
      if ((((buf[0x1b] & 1U) == 0) && (tm.tm_mon == -1)) &&
         (tm.tm_mon = checktz((char *)&len), tm.tm_mon != -1)) {
        buf[0x1b] = '\x01';
      }
      if ((buf[0x1b] & 1U) == 0) {
        return -1;
      }
      output_local = (time_t *)(sStack_a0 + (long)output_local);
    }
    buf._28_4_ = buf._28_4_ + 1;
  } while( true );
}

Assistant:

static int parsedate(const char *date, time_t *output)
{
  time_t t = 0;
  int wdaynum = -1;  /* day of the week number, 0-6 (mon-sun) */
  int monnum = -1;   /* month of the year number, 0-11 */
  int mdaynum = -1; /* day of month, 1 - 31 */
  int hournum = -1;
  int minnum = -1;
  int secnum = -1;
  int yearnum = -1;
  int tzoff = -1;
  struct my_tm tm;
  enum assume dignext = DATE_MDAY;
  const char *indate = date; /* save the original pointer */
  int part = 0; /* max 6 parts */

  while(*date && (part < 6)) {
    bool found = FALSE;

    skip(&date);

    if(ISALPHA(*date)) {
      /* a name coming up */
      char buf[32]="";
      size_t len;
      if(sscanf(date, "%31[ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                          "abcdefghijklmnopqrstuvwxyz]", buf))
        len = strlen(buf);
      else
        len = 0;

      if(wdaynum == -1) {
        wdaynum = checkday(buf, len);
        if(wdaynum != -1)
          found = TRUE;
      }
      if(!found && (monnum == -1)) {
        monnum = checkmonth(buf);
        if(monnum != -1)
          found = TRUE;
      }

      if(!found && (tzoff == -1)) {
        /* this just must be a time zone string */
        tzoff = checktz(buf);
        if(tzoff != -1)
          found = TRUE;
      }

      if(!found)
        return PARSEDATE_FAIL; /* bad string */

      date += len;
    }
    else if(ISDIGIT(*date)) {
      /* a digit */
      int val;
      char *end;
      int len = 0;
      if((secnum == -1) &&
         (3 == sscanf(date, "%02d:%02d:%02d%n",
                      &hournum, &minnum, &secnum, &len))) {
        /* time stamp! */
        date += len;
      }
      else if((secnum == -1) &&
              (2 == sscanf(date, "%02d:%02d%n", &hournum, &minnum, &len))) {
        /* time stamp without seconds */
        date += len;
        secnum = 0;
      }
      else {
        long lval;
        int error;
        int old_errno;

        old_errno = errno;
        errno = 0;
        lval = strtol(date, &end, 10);
        error = errno;
        if(errno != old_errno)
          errno = old_errno;

        if(error)
          return PARSEDATE_FAIL;

#if LONG_MAX != INT_MAX
        if((lval > (long)INT_MAX) || (lval < (long)INT_MIN))
          return PARSEDATE_FAIL;
#endif

        val = curlx_sltosi(lval);

        if((tzoff == -1) &&
           ((end - date) == 4) &&
           (val <= 1400) &&
           (indate< date) &&
           ((date[-1] == '+' || date[-1] == '-'))) {
          /* four digits and a value less than or equal to 1400 (to take into
             account all sorts of funny time zone diffs) and it is preceded
             with a plus or minus. This is a time zone indication.  1400 is
             picked since +1300 is frequently used and +1400 is mentioned as
             an edge number in the document "ISO C 200X Proposal: Timezone
             Functions" at http://david.tribble.com/text/c0xtimezone.html If
             anyone has a more authoritative source for the exact maximum time
             zone offsets, please speak up! */
          found = TRUE;
          tzoff = (val/100 * 60 + val%100)*60;

          /* the + and - prefix indicates the local time compared to GMT,
             this we need their reversed math to get what we want */
          tzoff = date[-1]=='+'?-tzoff:tzoff;
        }

        if(((end - date) == 8) &&
           (yearnum == -1) &&
           (monnum == -1) &&
           (mdaynum == -1)) {
          /* 8 digits, no year, month or day yet. This is YYYYMMDD */
          found = TRUE;
          yearnum = val/10000;
          monnum = (val%10000)/100-1; /* month is 0 - 11 */
          mdaynum = val%100;
        }

        if(!found && (dignext == DATE_MDAY) && (mdaynum == -1)) {
          if((val > 0) && (val<32)) {
            mdaynum = val;
            found = TRUE;
          }
          dignext = DATE_YEAR;
        }

        if(!found && (dignext == DATE_YEAR) && (yearnum == -1)) {
          yearnum = val;
          found = TRUE;
          if(yearnum < 100) {
            if(yearnum > 70)
              yearnum += 1900;
            else
              yearnum += 2000;
          }
          if(mdaynum == -1)
            dignext = DATE_MDAY;
        }

        if(!found)
          return PARSEDATE_FAIL;

        date = end;
      }
    }

    part++;
  }

  if(-1 == secnum)
    secnum = minnum = hournum = 0; /* no time, make it zero */

  if((-1 == mdaynum) ||
     (-1 == monnum) ||
     (-1 == yearnum))
    /* lacks vital info, fail */
    return PARSEDATE_FAIL;

#ifdef HAVE_TIME_T_UNSIGNED
  if(yearnum < 1970) {
    /* only positive numbers cannot return earlier */
    *output = TIME_T_MIN;
    return PARSEDATE_SOONER;
  }
#endif

#if (SIZEOF_TIME_T < 5)

#ifdef HAVE_TIME_T_UNSIGNED
  /* an unsigned 32 bit time_t can only hold dates to 2106 */
  if(yearnum > 2105) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER;
  }
#else
  /* a signed 32 bit time_t can only hold dates to the beginning of 2038 */
  if(yearnum > 2037) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER;
  }
  if(yearnum < 1903) {
    *output = TIME_T_MIN;
    return PARSEDATE_SOONER;
  }
#endif

#else
  /* The Gregorian calendar was introduced 1582 */
  if(yearnum < 1583)
    return PARSEDATE_FAIL;
#endif

  if((mdaynum > 31) || (monnum > 11) ||
     (hournum > 23) || (minnum > 59) || (secnum > 60))
    return PARSEDATE_FAIL; /* clearly an illegal date */

  tm.tm_sec = secnum;
  tm.tm_min = minnum;
  tm.tm_hour = hournum;
  tm.tm_mday = mdaynum;
  tm.tm_mon = monnum;
  tm.tm_year = yearnum;

  /* my_timegm() returns a time_t. time_t is often 32 bits, sometimes even on
     architectures that feature 64 bit 'long' but ultimately time_t is the
     correct data type to use.
  */
  my_timegm(&tm, &t);

  /* Add the time zone diff between local time zone and GMT. */
  if(tzoff == -1)
    tzoff = 0;

  if((tzoff > 0) && (t > TIME_T_MAX - tzoff)) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER; /* time_t overflow */
  }

  t += tzoff;

  *output = t;

  return PARSEDATE_OK;
}